

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string * __thiscall crnlib::dynamic_string::crop(dynamic_string *this,uint start,uint len)

{
  uint uVar1;
  char *__dest;
  
  uVar1 = this->m_len - start;
  if (this->m_len < start || uVar1 == 0) {
    clear(this);
  }
  else {
    if (len < uVar1) {
      uVar1 = len;
    }
    if (start != 0) {
      __dest = "";
      if (this->m_pStr != (char *)0x0) {
        __dest = this->m_pStr;
      }
      memmove(__dest,__dest + start,(ulong)uVar1);
    }
    this->m_pStr[uVar1] = '\0';
    this->m_len = (uint16)uVar1;
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::crop(uint start, uint len)
    {
        if (start >= m_len)
        {
            clear();
            return *this;
        }

        len = math::minimum<uint>(len, m_len - start);

        if (start)
        {
            memmove(get_ptr_priv(), get_ptr_priv() + start, len);
        }

        m_pStr[len] = '\0';

        m_len = static_cast<uint16>(len);

        check();

        return *this;
    }